

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O2

int ptls_compare_separator_line(char *line,char *begin_or_end,char *label)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  
  iVar1 = strncmp(line,"-----",5);
  if (iVar1 == 0) {
    sVar2 = strlen(begin_or_end);
    iVar1 = strncmp(line + 5,begin_or_end,sVar2);
    if (iVar1 == 0) {
      lVar3 = sVar2 + 6;
      iVar1 = line[sVar2 + 5] + -0x20;
      if (iVar1 == 0) {
        sVar2 = strlen(label);
        iVar1 = strncmp(line + lVar3,label,sVar2);
        lVar3 = lVar3 + sVar2;
      }
      if (iVar1 == 0) {
        iVar1 = strncmp(line + lVar3,"-----",5);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int ptls_compare_separator_line(const char *line, const char *begin_or_end, const char *label)
{
    int ret = strncmp(line, "-----", 5);
    size_t text_index = 5;

    if (ret == 0) {
        size_t begin_or_end_length = strlen(begin_or_end);
        ret = strncmp(line + text_index, begin_or_end, begin_or_end_length);
        text_index += begin_or_end_length;
    }

    if (ret == 0) {
        ret = line[text_index] - ' ';
        text_index++;
    }

    if (ret == 0) {
        size_t label_length = strlen(label);
        ret = strncmp(line + text_index, label, label_length);
        text_index += label_length;
    }

    if (ret == 0) {
        ret = strncmp(line + text_index, "-----", 5);
    }

    return ret;
}